

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

uint32_t helper_testblock(CPUS390XState_conflict *env,uint64_t real_addr)

{
  ulong uVar1;
  uintptr_t unaff_retaddr;
  
  uVar1 = (env->psw).mask;
  if ((uVar1 >> 0x20 & 1) == 0) {
    if ((int)uVar1 < 0) {
      real_addr = (uint64_t)((uint)real_addr & 0x7fffffff);
    }
    else {
      real_addr = (uint64_t)((uint)real_addr & 0xffffff);
    }
  }
  uVar1 = 0xfffffffffffffff8;
  do {
    cpu_stq_mmuidx_ra_s390x(env,uVar1 + (real_addr & 0xfffffffffffff000) + 8,0,3,unaff_retaddr);
    uVar1 = uVar1 + 8;
  } while (uVar1 < 0xff8);
  return 0;
}

Assistant:

uint32_t HELPER(testblock)(CPUS390XState *env, uint64_t real_addr)
{
    uintptr_t ra = GETPC();
    int i;

    real_addr = wrap_address(env, real_addr) & TARGET_PAGE_MASK;

    for (i = 0; i < TARGET_PAGE_SIZE; i += 8) {
        cpu_stq_mmuidx_ra(env, real_addr + i, 0, MMU_REAL_IDX, ra);
    }

    return 0;
}